

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O0

void __thiscall
pg::PSISolver::compute_all_val(PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head)

{
  long lVar1;
  int local_28;
  int local_24;
  int i;
  int count;
  Task *__lace_dq_head_local;
  WorkerP *__lace_worker_local;
  PSISolver *this_local;
  
  lVar1 = Solver::nodecount(&this->super_Solver);
  reset_done_CALL(__lace_worker,__lace_dq_head,0,(int)lVar1);
  lVar1 = Solver::nodecount(&this->super_Solver);
  set_in_CALL(__lace_worker,__lace_dq_head,0,(int)lVar1);
  local_24 = 0;
  _i = __lace_dq_head;
  for (local_28 = 0; lVar1 = Solver::nodecount(&this->super_Solver), local_28 < lVar1;
      local_28 = local_28 + 1) {
    if ((*(int *)(done + (long)local_28 * 4) != 3) &&
       ((*(int *)(pg::str + (long)local_28 * 4) == -1 ||
        (*(int *)(halt + (long)*(int *)(pg::str + (long)local_28 * 4) * 4) != 0)))) {
      compute_val_SPAWN(__lace_worker,_i,local_28,this);
      _i = _i + 1;
      local_24 = local_24 + 1;
    }
  }
  while (local_24 != 0) {
    _i = _i + -1;
    compute_val_SYNC(__lace_worker,_i);
    local_24 = local_24 + -1;
  }
  return;
}

Assistant:

void
PSISolver::compute_all_val(WorkerP* __lace_worker, Task* __lace_dq_head)
{
    // reset "done" (for nodes that are not disabled or won)
    CALL(reset_done, 0, nodecount());
    CALL(set_in, 0, nodecount());
    // for all unsolved enabled nodes that go to sink, run compute val
    int count = 0;
    for (int i=0; i<nodecount(); i++) {
        if (done[i] == 3) continue;
        if (str[i] == -1 or halt[str[i]]) { // str[i] is -2 for disabled and not -1 for won
            SPAWN(compute_val, i, this);
            count++;
        }
    }
    while (count--) {
        SYNC(compute_val);
    }
}